

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O2

ExceptionOr<kj::Maybe<kj::HttpHeaders::Request>_> * __thiscall
kj::_::ExceptionOr<kj::Maybe<kj::HttpHeaders::Request>_>::operator=
          (ExceptionOr<kj::Maybe<kj::HttpHeaders::Request>_> *this,
          ExceptionOr<kj::Maybe<kj::HttpHeaders::Request>_> *param_1)

{
  NullableValue<kj::Exception>::operator=
            ((NullableValue<kj::Exception> *)this,(NullableValue<kj::Exception> *)param_1);
  NullableValue<kj::Maybe<kj::HttpHeaders::Request>_>::operator=
            (&(this->value).ptr,&(param_1->value).ptr);
  return this;
}

Assistant:

ExceptionOr& operator=(ExceptionOr&&) = default;